

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall
FfsParser::parseFreeformGuidedSectionHeader
          (FfsParser *this,UByteArray *section,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index,bool insertIntoTree)

{
  byte type;
  char cVar1;
  TreeModel *pTVar2;
  bool bVar3;
  uint uVar4;
  UINT32 UVar5;
  UINT8 *ffsSize;
  undefined7 in_register_00000089;
  uint len;
  UByteArray local_128;
  UModelIndex *local_108;
  UINT32 local_100;
  undefined4 local_fc;
  EFI_GUID guid;
  UModelIndex local_e8;
  UModelIndex parentVolumeIndex;
  UByteArray header;
  CBString local_98;
  CBString info;
  CBString name;
  UByteArray body;
  
  if (((section->d)._M_string_length & 0xfffffffc) == 0) {
    return 0x14;
  }
  local_fc = (undefined4)CONCAT71(in_register_00000089,insertIntoTree);
  local_100 = localOffset;
  TreeModel::findParentOfType(&parentVolumeIndex,this->model,parent,'A');
  if ((((parentVolumeIndex.r < 0) || (parentVolumeIndex.c < 0)) ||
      (parentVolumeIndex.m == (TreeModel *)0x0)) ||
     (bVar3 = TreeModel::hasEmptyParsingData(this->model,&parentVolumeIndex), bVar3)) {
    ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
  }
  else {
    local_108 = index;
    TreeModel::parsingData(&header,this->model,&parentVolumeIndex);
    cVar1 = header.d._M_dataplus._M_p[0x19];
    std::__cxx11::string::~string((string *)&header);
    ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
    index = local_108;
    if ((cVar1 == '\x03') && (UVar5 = uint24ToUint32(ffsSize), index = local_108, UVar5 == 0xffffff)
       ) {
      uVar4 = (uint)(section->d)._M_string_length;
      if (uVar4 < 0x18) {
        return 0x14;
      }
      guid._0_8_ = *(undefined8 *)(ffsSize + 8);
      guid.Data4 = *(UINT8 (*) [8])(ffsSize + 0x10);
      len = 0x18;
      goto LAB_0012ca89;
    }
  }
  guid._0_8_ = *(undefined8 *)(ffsSize + 4);
  guid.Data4 = *(UINT8 (*) [8])(ffsSize + 0xc);
  uVar4 = (uint)(section->d)._M_string_length;
  len = 0x14;
LAB_0012ca89:
  if (uVar4 < len) {
    return 0x14;
  }
  type = ffsSize[3];
  UByteArray::left(&header,section,len);
  UByteArray::mid(&body,section,len,-1);
  sectionTypeToUString((CBString *)&local_128,type);
  Bstrlib::CBString::operator+(&name,(CBString *)&local_128," section");
  Bstrlib::CBString::~CBString((CBString *)&local_128);
  uVar4 = (uint)(section->d)._M_string_length;
  usprintf((CBString *)&local_128,
           "Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nSubtype GUID: "
           ,(ulong)type,(ulong)uVar4,(ulong)uVar4,(ulong)(uint)header.d._M_string_length,
           (ulong)(uint)header.d._M_string_length,(ulong)(uint)body.d._M_string_length,
           (ulong)(uint)body.d._M_string_length);
  guidToUString((CBString *)&local_e8,&guid,false);
  Bstrlib::CBString::operator+(&info,(CBString *)&local_128,(CBString *)&local_e8);
  Bstrlib::CBString::~CBString((CBString *)&local_e8);
  Bstrlib::CBString::~CBString((CBString *)&local_128);
  if ((char)local_fc != '\0') {
    pTVar2 = this->model;
    Bstrlib::CBString::CBString(&local_98);
    local_128.d._M_dataplus._M_p = (pointer)&local_128.d.field_2;
    local_128.d._M_string_length = 0;
    local_128.d.field_2._M_local_buf[0] = '\0';
    TreeModel::addItem(&local_e8,pTVar2,local_100,'C',type,&name,&local_98,&info,&header,&body,
                       &local_128,Movable,parent,'\0');
    index->m = local_e8.m;
    index->r = local_e8.r;
    index->c = local_e8.c;
    index->i = local_e8.i;
    std::__cxx11::string::~string((string *)&local_128);
    Bstrlib::CBString::~CBString(&local_98);
    local_e8._0_8_ = guid._0_8_;
    local_e8.i._0_1_ = guid.Data4[0];
    local_e8.i._1_1_ = guid.Data4[1];
    local_e8.i._2_1_ = guid.Data4[2];
    local_e8.i._3_1_ = guid.Data4[3];
    local_e8.i._4_1_ = guid.Data4[4];
    local_e8.i._5_1_ = guid.Data4[5];
    local_e8.i._6_1_ = guid.Data4[6];
    local_e8.i._7_1_ = guid.Data4[7];
    pTVar2 = this->model;
    UByteArray::UByteArray(&local_128,(char *)&local_e8,0x10);
    TreeModel::setParsingData(pTVar2,index,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    pTVar2 = this->model;
    guidToUString((CBString *)&local_128,&guid,true);
    TreeModel::setName(pTVar2,index,(CBString *)&local_128);
    Bstrlib::CBString::~CBString((CBString *)&local_128);
  }
  Bstrlib::CBString::~CBString(&info);
  Bstrlib::CBString::~CBString(&name);
  std::__cxx11::string::~string((string *)&body);
  std::__cxx11::string::~string((string *)&header);
  return 0;
}

Assistant:

USTATUS FfsParser::parseFreeformGuidedSectionHeader(const UByteArray & section, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index, const bool insertIntoTree)
{
    // Check sanity
    if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER))
        return U_INVALID_SECTION;
    
    // Obtain required information from parent volume
    UINT8 ffsVersion = 2;
    UModelIndex parentVolumeIndex = model->findParentOfType(parent, Types::Volume);
    if (parentVolumeIndex.isValid() && model->hasEmptyParsingData(parentVolumeIndex) == false) {
        UByteArray data = model->parsingData(parentVolumeIndex);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        ffsVersion = pdata->ffsVersion;
    }
    
    // Obtain header fields
    UINT32 headerSize;
    EFI_GUID guid;
    UINT8 type;
    const EFI_COMMON_SECTION_HEADER* sectionHeader = (const EFI_COMMON_SECTION_HEADER*)(section.constData());
    const EFI_COMMON_SECTION_HEADER2* section2Header = (const EFI_COMMON_SECTION_HEADER2*)(section.constData());
    
    if (ffsVersion == 3 && uint24ToUint32(sectionHeader->Size) == EFI_SECTION2_IS_USED) { // Check for extended header section
        const EFI_FREEFORM_SUBTYPE_GUID_SECTION* fsgSectionHeader = (const EFI_FREEFORM_SUBTYPE_GUID_SECTION*)(section2Header + 1);
        if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_FREEFORM_SUBTYPE_GUID_SECTION))
            return U_INVALID_SECTION;
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_FREEFORM_SUBTYPE_GUID_SECTION);
        guid = fsgSectionHeader->SubTypeGuid;
        type = section2Header->Type;
    }
    else { // Normal section
        const EFI_FREEFORM_SUBTYPE_GUID_SECTION* fsgSectionHeader = (const EFI_FREEFORM_SUBTYPE_GUID_SECTION*)(sectionHeader + 1);
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER) + sizeof(EFI_FREEFORM_SUBTYPE_GUID_SECTION);
        guid = fsgSectionHeader->SubTypeGuid;
        type = sectionHeader->Type;
    }
    
    // Check sanity again
    if ((UINT32)section.size() < headerSize)
        return U_INVALID_SECTION;
    
    UByteArray header = section.left(headerSize);
    UByteArray body = section.mid(headerSize);
    
    // Get info
    UString name = sectionTypeToUString(type) + (" section");
    UString info = usprintf("Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nSubtype GUID: ",
                            type,
                            (UINT32)section.size(), (UINT32)section.size(),
                            (UINT32)header.size(), (UINT32)header.size(),
                            (UINT32)body.size(), (UINT32)body.size())
    + guidToUString(guid, false);
    
    // Add tree item
    if (insertIntoTree) {
        index = model->addItem(localOffset, Types::Section, type, name, UString(), info, header, body, UByteArray(), Movable, parent);
        
        // Set parsing data
        FREEFORM_GUIDED_SECTION_PARSING_DATA pdata = {};
        pdata.guid = guid;
        model->setParsingData(index, UByteArray((const char*)&pdata, sizeof(pdata)));
        
        // Rename section
        model->setName(index, guidToUString(guid));
    }
    
    return U_SUCCESS;
}